

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_ObjReadGroup(Str_Ntk_t *p,Str_Obj_t *pObj,int *pnGroups,int *pnMuxes)

{
  Str_Obj_t *pSVar1;
  Str_Obj_t *pSVar2;
  Str_Obj_t *pObj2;
  Str_Obj_t *pObj1;
  int *pnMuxes_local;
  int *pnGroups_local;
  Str_Obj_t *pObj_local;
  Str_Ntk_t *p_local;
  
  *pnMuxes = 0;
  *pnGroups = 0;
  if (pObj->iTop != 0) {
    pSVar1 = Str_NtkObj(p,pObj->iTop);
    pSVar2 = Str_NtkObj(p,pSVar1->iTop);
    *pnMuxes = (int)((long)pSVar1 - (long)pObj >> 4) + 1;
    *pnGroups = (int)((((long)pSVar2 - (long)pObj >> 4) + 1) / (long)*pnMuxes);
  }
  return;
}

Assistant:

static inline void Str_ObjReadGroup( Str_Ntk_t * p, Str_Obj_t * pObj, int * pnGroups, int * pnMuxes )
{
    Str_Obj_t * pObj1, * pObj2;
    *pnGroups = *pnMuxes = 0;
    if ( pObj->iTop == 0 )
        return;
    pObj1 = Str_NtkObj( p, pObj->iTop ); 
    pObj2 = Str_NtkObj( p, pObj1->iTop );
    *pnMuxes  = pObj1 - pObj + 1;
    *pnGroups = (pObj2 - pObj + 1) / *pnMuxes;
}